

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_ChangeCamera(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  AActor *pAVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  player_t *ppVar4;
  int i;
  long lVar5;
  AActor **obj;
  FActorIterator iterator;
  
  if (arg0 == 0) {
    pAVar1 = (AActor *)0x0;
  }
  else {
    iterator.base = (AActor *)0x0;
    iterator.id = arg0;
    pAVar1 = FActorIterator::Next(&iterator);
  }
  if ((it == (AActor *)0x0) || (arg1 != 0 || it->player == (player_t *)0x0)) {
    obj = (AActor **)&DAT_017dc0f8;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      if (playeringame[lVar5] == true) {
        pAVar2 = GC::ReadBarrier<AActor>(obj);
        if (pAVar1 == (AActor *)0x0) {
          *obj = obj[-0x2f];
          *(byte *)(obj + -0x12) = *(byte *)(obj + -0x12) & 0x7f;
        }
        else {
          *obj = pAVar1;
          if (arg2 != 0) {
            *(byte *)(obj + -0x12) = *(byte *)(obj + -0x12) | 0x80;
          }
        }
        pAVar3 = GC::ReadBarrier<AActor>(obj);
        if (pAVar2 != pAVar3) {
          pAVar2 = GC::ReadBarrier<AActor>(obj);
          R_ClearPastViewer(pAVar2);
        }
      }
      obj = obj + 0x54;
    }
  }
  else {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&it->player->camera);
    if (pAVar1 == (AActor *)0x0) {
      (it->player->camera).field_0.p = it;
      ppVar4 = it->player;
      ppVar4->cheats = ppVar4->cheats & 0xffffff7f;
    }
    else {
      (it->player->camera).field_0.p = pAVar1;
      ppVar4 = it->player;
      if (arg2 != 0) {
        *(byte *)&ppVar4->cheats = (byte)ppVar4->cheats | 0x80;
      }
    }
    pAVar1 = GC::ReadBarrier<AActor>((AActor **)&ppVar4->camera);
    if (pAVar2 != pAVar1) {
      pAVar1 = GC::ReadBarrier<AActor>((AActor **)&it->player->camera);
      R_ClearPastViewer(pAVar1);
    }
  }
  return 1;
}

Assistant:

FUNC(LS_ChangeCamera)
// ChangeCamera (tid, who, revert?)
{
	AActor *camera;
	if (arg0 != 0)
	{
		FActorIterator iterator (arg0);
		camera = iterator.Next ();
	}
	else
	{
		camera = NULL;
	}

	if (!it || !it->player || arg1)
	{
		int i;

		for (i = 0; i < MAXPLAYERS; i++)
		{
			if (!playeringame[i])
				continue;

			AActor *oldcamera = players[i].camera;
			if (camera)
			{
				players[i].camera = camera;
				if (arg2)
					players[i].cheats |= CF_REVERTPLEASE;
			}
			else
			{
				players[i].camera = players[i].mo;
				players[i].cheats &= ~CF_REVERTPLEASE;
			}
			if (oldcamera != players[i].camera)
			{
				R_ClearPastViewer (players[i].camera);
			}
		}
	}
	else
	{
		AActor *oldcamera = it->player->camera;
		if (camera)
		{
			it->player->camera = camera;
			if (arg2)
				it->player->cheats |= CF_REVERTPLEASE;
		}
		else
		{
			it->player->camera = it;
			it->player->cheats &= ~CF_REVERTPLEASE;
		}
		if (oldcamera != it->player->camera)
		{
			R_ClearPastViewer (it->player->camera);
		}
	}

	return true;
}